

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ValueHolder * __thiscall
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (internal *this,ThreadLocalValueHolderBase *base)

{
  iterator __position;
  bool bVar1;
  ValueHolder *pVVar2;
  long lVar3;
  GTestLog local_14;
  
  if (this != (internal *)0x0) {
    bVar1 = std::type_info::operator==
                      (*(type_info **)(*(long *)this + -8),
                       (type_info *)
                       &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                        typeinfo);
    if (!bVar1) {
      GTestLog::GTestLog(&local_14,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/gtest/googletest/include/gtest/internal/gtest-port.h"
                         ,0x44d);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_14);
    }
    pVVar2 = (ValueHolder *)
             __dynamic_cast(this,&ThreadLocalValueHolderBase::typeinfo,
                            &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                             typeinfo,0);
    return pVVar2;
  }
  __cxa_bad_typeid();
  __position._M_current =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 8);
  if (__position._M_current ==
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
       ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 0x10)) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_realloc_insert<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,__position,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)base);
    lVar3 = *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 8)
    ;
  }
  else {
    std::__cxx11::string::string((string *)__position._M_current,(string *)base);
    lVar3 = *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 8)
            + 0x20;
    *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this + 8) = lVar3
    ;
  }
  return (ValueHolder *)(lVar3 + -0x20);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}